

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_dec.c
# Opt level: O1

int ExportAlpha(WebPDecParams *p,int y_pos,int max_lines_out)

{
  WEBP_CSP_MODE WVar1;
  int iVar2;
  WebPDecBuffer *pWVar3;
  WebPRescaler *wrk;
  bool bVar4;
  uint uVar5;
  uint8_t *puVar6;
  uint uVar7;
  uint8_t *puVar8;
  int iVar9;
  
  pWVar3 = p->output;
  puVar6 = (pWVar3->u).RGBA.rgba + (long)(pWVar3->u).RGBA.stride * (long)y_pos;
  WVar1 = pWVar3->colorspace;
  puVar8 = puVar6 + (ulong)(WVar1 != MODE_Argb && WVar1 != MODE_ARGB) * 3;
  iVar2 = p->scaler_a->dst_width;
  iVar9 = 0;
  uVar7 = 0;
  while( true ) {
    wrk = p->scaler_a;
    if (wrk->dst_y < wrk->dst_height) {
      bVar4 = wrk->y_accum < 1;
    }
    else {
      bVar4 = false;
    }
    if ((!bVar4) || (max_lines_out <= iVar9)) break;
    WebPRescalerExportRow(wrk);
    uVar5 = (*WebPDispatchAlpha)(p->scaler_a->dst,0,iVar2,1,puVar8,0);
    uVar7 = uVar7 | uVar5;
    puVar8 = puVar8 + (pWVar3->u).RGBA.stride;
    iVar9 = iVar9 + 1;
  }
  if ((WVar1 - MODE_rgbA < 4) && (uVar7 != 0)) {
    (*WebPApplyAlphaMultiply)
              (puVar6,SUB14(WVar1 == MODE_Argb || WVar1 == MODE_ARGB,0),iVar2,iVar9,
               (pWVar3->u).RGBA.stride);
  }
  return iVar9;
}

Assistant:

static int ExportAlpha(WebPDecParams* const p, int y_pos, int max_lines_out) {
  const WebPRGBABuffer* const buf = &p->output->u.RGBA;
  uint8_t* const base_rgba = buf->rgba + (size_t)y_pos * buf->stride;
  const WEBP_CSP_MODE colorspace = p->output->colorspace;
  const int alpha_first =
      (colorspace == MODE_ARGB || colorspace == MODE_Argb);
  uint8_t* dst = base_rgba + (alpha_first ? 0 : 3);
  int num_lines_out = 0;
  const int is_premult_alpha = WebPIsPremultipliedMode(colorspace);
  uint32_t non_opaque = 0;
  const int width = p->scaler_a->dst_width;

  while (WebPRescalerHasPendingOutput(p->scaler_a) &&
         num_lines_out < max_lines_out) {
    assert(y_pos + num_lines_out < p->output->height);
    WebPRescalerExportRow(p->scaler_a);
    non_opaque |= WebPDispatchAlpha(p->scaler_a->dst, 0, width, 1, dst, 0);
    dst += buf->stride;
    ++num_lines_out;
  }
  if (is_premult_alpha && non_opaque) {
    WebPApplyAlphaMultiply(base_rgba, alpha_first,
                           width, num_lines_out, buf->stride);
  }
  return num_lines_out;
}